

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::utp_socket_impl::incoming
          (utp_socket_impl *this,uint8_t *buf,int size,packet_ptr *p,time_point param_4)

{
  ushort uVar1;
  int iVar2;
  error_category *__src;
  bool bVar3;
  uint16_t uVar4;
  pointer ppVar5;
  long *plVar6;
  char *__dest;
  index_type iVar7;
  pointer ppVar8;
  unsigned_long __n;
  undefined1 local_98 [48];
  const_iterator local_68;
  span<char> local_60;
  pointer local_50;
  pointer local_48;
  int local_3c;
  reference pvStack_38;
  int to_copy;
  iovec_t *target;
  packet_ptr *p_local;
  error_category *peStack_20;
  int size_local;
  uint8_t *buf_local;
  utp_socket_impl *this_local;
  time_point param_4_local;
  
  target = (iovec_t *)p;
  p_local._4_4_ = size;
  peStack_20 = (error_category *)buf;
  buf_local = (uint8_t *)this;
  this_local = (utp_socket_impl *)param_4.__d.__r;
  if (0 < size) {
    do {
      bVar3 = ::std::vector<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>::empty
                        (&this->m_read_buffer);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        bVar3 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)p);
        if (!bVar3) {
          acquire_packet((utp_socket_impl *)local_98,(int)this);
          ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::operator=
                    (p,(unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)
                       local_98);
          ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::~unique_ptr
                    ((unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)
                     local_98);
          uVar4 = (uint16_t)p_local._4_4_;
          ppVar8 = ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::
                   operator->(p);
          ppVar8->size = uVar4;
          ppVar8 = ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::
                   operator->(p);
          ppVar8->header_size = 0;
          ppVar8 = ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::
                   operator->(p);
          __src = peStack_20;
          __n = numeric_cast<unsigned_long,int,void>(p_local._4_4_);
          memcpy(ppVar8->buf,__src,__n);
        }
        ppVar8 = ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::
                 operator->(p);
        uVar1 = ppVar8->size;
        ppVar8 = ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::
                 operator->(p);
        this->m_receive_buffer_size =
             ((uint)uVar1 - (uint)ppVar8->header_size) + this->m_receive_buffer_size;
        ::std::
        vector<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>,std::allocator<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>>>
        ::emplace_back<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>>
                  ((vector<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>,std::allocator<std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>>>
                    *)&this->m_receive_buffer,p);
        return;
      }
      bVar3 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)p);
      if (bVar3) {
        ppVar8 = ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::
                 operator->(p);
        ppVar5 = ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::
                 operator->(p);
        peStack_20 = (error_category *)(ppVar8->buf + (int)(uint)ppVar5->header_size);
      }
      pvStack_38 = ::std::vector<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>::
                   front(&this->m_read_buffer);
      local_48 = (pointer)(long)p_local._4_4_;
      local_50 = (pointer)span<char>::size(pvStack_38);
      plVar6 = ::std::min<long>((long *)&local_48,(long *)&local_50);
      local_3c = (int)*plVar6;
      __dest = span<char>::data(pvStack_38);
      memcpy(__dest,peStack_20,(long)local_3c);
      this->m_read = local_3c + this->m_read;
      local_60 = span<char>::subspan(pvStack_38,(long)local_3c);
      pvStack_38->m_ptr = local_60.m_ptr;
      pvStack_38->m_len = local_60.m_len;
      peStack_20 = (error_category *)((long)&peStack_20->_vptr_error_category + (long)local_3c);
      this->m_read_buffer_size = this->m_read_buffer_size - local_3c;
      p_local._4_4_ = p_local._4_4_ - local_3c;
      iVar7 = span<char>::size(pvStack_38);
      if (iVar7 == 0) {
        local_98._40_8_ =
             ::std::vector<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>::begin
                       (&this->m_read_buffer);
        __gnu_cxx::
        __normal_iterator<libtorrent::span<char>const*,std::vector<libtorrent::span<char>,std::allocator<libtorrent::span<char>>>>
        ::__normal_iterator<libtorrent::span<char>*>
                  ((__normal_iterator<libtorrent::span<char>const*,std::vector<libtorrent::span<char>,std::allocator<libtorrent::span<char>>>>
                    *)&local_68,
                   (__normal_iterator<libtorrent::span<char>_*,_std::vector<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>_>
                    *)(local_98 + 0x28));
        local_98._32_8_ =
             ::std::vector<libtorrent::span<char>,_std::allocator<libtorrent::span<char>_>_>::erase
                       (&this->m_read_buffer,local_68);
      }
      bVar3 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)p);
      iVar2 = local_3c;
      if (bVar3) {
        ppVar8 = ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::
                 operator->(p);
        ppVar8->header_size = ppVar8->header_size + (short)iVar2;
      }
    } while (p_local._4_4_ != 0);
    ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::unique_ptr
              ((unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)
               (local_98 + 0x18),p);
    release_packet(this,(unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)
                        (local_98 + 0x18));
    ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::~unique_ptr
              ((unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)
               (local_98 + 0x18));
  }
  return;
}

Assistant:

void utp_socket_impl::incoming(std::uint8_t const* buf, int size, packet_ptr p
	, time_point /* now */)
{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
	INVARIANT_CHECK;
#endif

	TORRENT_ASSERT(size >= 0);
	if (size <= 0) return;

	// if a packet, p, is passed in here, the buf argument is ignored, and size
	// is redundant, as it must match p->size
	TORRENT_ASSERT(!p || p->size - p->header_size == size);
	TORRENT_ASSERT(!p || !buf);

	while (!m_read_buffer.empty())
	{
		UTP_LOGV("%8p: incoming: have user buffer (%d)\n", static_cast<void*>(this), m_read_buffer_size);
		if (p)
		{
			buf = p->buf + p->header_size;
			TORRENT_ASSERT(p->size - p->header_size >= size);
		}
		iovec_t* target = &m_read_buffer.front();

		int const to_copy = static_cast<int>(std::min(std::ptrdiff_t(size), target->size()));
		TORRENT_ASSERT(to_copy >= 0);
		std::memcpy(target->data(), buf, std::size_t(to_copy));
		m_read += to_copy;
		*target = target->subspan(to_copy);
		buf += to_copy;
		TORRENT_ASSERT(m_read_buffer_size >= to_copy);
		m_read_buffer_size -= to_copy;
		size -= to_copy;
		UTP_LOGV("%8p: copied %d bytes into user receive buffer\n", static_cast<void*>(this), to_copy);
		if (target->size() == 0) m_read_buffer.erase(m_read_buffer.begin());
		if (p)
		{
			p->header_size += std::uint16_t(to_copy);
			TORRENT_ASSERT(p->header_size <= p->size);
		}

		if (size == 0)
		{
			TORRENT_ASSERT(!p || p->header_size == p->size);
			release_packet(std::move(p));
			return;
		}
	}

	TORRENT_ASSERT(m_read_buffer_size == 0);

	if (!p)
	{
		TORRENT_ASSERT(buf);
		p = acquire_packet(size);
		p->size = std::uint16_t(size);
		p->header_size = 0;
		std::memcpy(p->buf, buf, aux::numeric_cast<std::size_t>(size));
	}
	// save this packet until the client issues another read
	m_receive_buffer_size += p->size - p->header_size;
	m_receive_buffer.emplace_back(std::move(p));

	UTP_LOGV("%8p: incoming: saving packet in receive buffer (%d)\n", static_cast<void*>(this), m_receive_buffer_size);

#if TORRENT_USE_INVARIANT_CHECKS
	check_receive_buffers();
#endif
}